

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O2

int expand_expect(dmr_C *C,expression *expr,int cost)

{
  undefined8 uVar1;
  position pVar2;
  symbol *psVar3;
  undefined8 uVar4;
  unsigned_long_long uVar5;
  string *psVar6;
  expression *peVar7;
  undefined8 *puVar8;
  
  puVar8 = (undefined8 *)ptrlist_first((ptr_list *)(expr->field_5).field_2.string);
  if (puVar8 != (undefined8 *)0x0) {
    uVar1 = *puVar8;
    pVar2 = *(position *)(puVar8 + 1);
    psVar3 = (symbol *)puVar8[2];
    uVar4 = puVar8[3];
    uVar5 = puVar8[4];
    psVar6 = (string *)puVar8[5];
    peVar7 = (expression *)puVar8[7];
    (expr->field_5).field_10.cond_false = (expression *)puVar8[6];
    (expr->field_5).field_14.ident_expression = peVar7;
    (expr->field_5).field_0.value = uVar5;
    (expr->field_5).field_2.string = psVar6;
    expr->ctype = psVar3;
    *(undefined8 *)&expr->field_0x18 = uVar4;
    *(undefined8 *)expr = uVar1;
    expr->pos = pVar2;
  }
  return 0;
}

Assistant:

static int expand_expect(struct dmr_C *C, struct expression *expr, int cost)
{
	struct expression *arg = dmrC_first_expression(expr->args);
	(void)C;
	(void)cost;

	if (arg)
		*expr = *arg;
	return 0;
}